

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalize.hpp
# Opt level: O2

void re::math::normalize<float,_1l,_1l>(span<const_float,__1L> in,span<float,__1L> out)

{
  uint __line;
  char *__assertion;
  anon_class_4_1_ba1d79ab __unary_op;
  span<const_float,__1L> in_local;
  span<float,__1L> out_local;
  span_iterator<gsl::span<const_float,__1L>,_false> local_68;
  span<float,__1L> *local_58;
  undefined8 local_50;
  span_iterator<gsl::span<float,__1L>,_false> local_48;
  span_iterator<gsl::span<const_float,__1L>,_false> local_38;
  undefined1 *local_28;
  long local_20;
  undefined1 *local_18;
  undefined8 local_10;
  
  out_local.storage_.data_ = out.storage_.data_;
  out_local.storage_.super_extent_type<_1L> = out.storage_.super_extent_type<_1L>.size_;
  in_local.storage_.data_ = in.storage_.data_;
  in_local.storage_.super_extent_type<_1L> = in.storage_.super_extent_type<_1L>.size_;
  if (in_local.storage_.super_extent_type<_1L>.size_ ==
      out_local.storage_.super_extent_type<_1L>.size_) {
    local_10 = 0;
    local_28 = (undefined1 *)&in_local;
    local_20 = in_local.storage_.super_extent_type<_1L>.size_;
    local_18 = (undefined1 *)&in_local;
    __unary_op.sum =
         ::std::
         accumulate<gsl::details::span_iterator<gsl::span<float_const,_1l>,false>,float,re::math::normalize<float,_1l,_1l>(gsl::span<float_const,_1l>,gsl::span<float,_1l>)::_lambda(auto:1,auto:2)_1_>
                   (&local_18);
    if (0.0 <= __unary_op.sum) {
      local_38.index_ = 0;
      local_48.index_ = in_local.storage_.super_extent_type<_1L>.size_;
      local_58 = &out_local;
      local_50 = 0;
      local_48.span_ = (span<float,__1L> *)&in_local;
      local_38.span_ = &in_local;
      ::std::
      transform<gsl::details::span_iterator<gsl::span<float_const,_1l>,false>,gsl::details::span_iterator<gsl::span<float,_1l>,false>,re::math::normalize<float,_1l,_1l>(gsl::span<float_const,_1l>,gsl::span<float,_1l>)::_lambda(auto:1)_1_>
                (&local_68,&local_38,&local_48,__unary_op);
      return;
    }
    __assertion = "sum >= 0";
    __line = 0x1a;
  }
  else {
    __assertion = "std::size(in) == std::size(out)";
    __line = 0x10;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/include/re/lib/math/normalize.hpp"
                ,__line,
                "void re::math::normalize(gsl::span<const T, N_in>, gsl::span<T, N_out>) [T = float, N_in = -1L, N_out = -1L]"
               );
}

Assistant:

void
normalize(gsl::span<T const, N_in> in, gsl::span<T, N_out> out)
noexcept {
    assert(std::size(in) == std::size(out));
    auto sum = std::accumulate(
        std::cbegin(in),
        std::cend(in),
        static_cast<T>(0),
        [] (const auto result, const auto value) {
            return result + std::fmax(value, 0);
        }
    );

    assert(sum >= 0);
    std::transform(
        std::cbegin(in),
        std::cend(in),
        std::begin(out),
        [sum] (auto v) {
            return v / sum;
        }
    );
}